

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger base_type(HSQUIRRELVM v)

{
  SQSharedState *ss;
  SQObjectPtr *obj1;
  SQChar *s;
  SQString *x;
  SQObjectPtr local_20;
  
  obj1 = stack_get(v,2);
  ss = v->_sharedstate;
  s = GetTypeName(obj1);
  x = SQString::Create(ss,s,-1);
  SQObjectPtr::SQObjectPtr(&local_20,x);
  SQVM::Push(v,&local_20);
  SQObjectPtr::~SQObjectPtr(&local_20);
  return 1;
}

Assistant:

static SQInteger base_type(HSQUIRRELVM v)
{
    SQObjectPtr &o = stack_get(v,2);
    v->Push(SQString::Create(_ss(v),GetTypeName(o),-1));
    return 1;
}